

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutCase.cpp
# Opt level: O2

void deqp::gles31::bb::anon_unknown_11::generateImmMatrixSrc
               (ostream *src,DataType basicType,int matrixStride,bool isRowMajor,void *valuePtr)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  ostream *poVar5;
  int extraout_EDX;
  int precision;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  string local_50;
  
  iVar1 = glu::getDataTypeMatrixNumRows(basicType);
  iVar2 = glu::getDataTypeMatrixNumColumns(basicType);
  pcVar4 = glu::getDataTypeName(basicType);
  poVar5 = std::operator<<(src,pcVar4);
  std::operator<<(poVar5,"(");
  iVar11 = 0;
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  if (iVar2 < 1) {
    iVar2 = iVar11;
  }
  iVar6 = 0;
  precision = extraout_EDX;
  for (iVar3 = 0; iVar3 != iVar2; iVar3 = iVar3 + 1) {
    iVar7 = iVar6;
    iVar10 = iVar11;
    for (iVar8 = 0; iVar1 != iVar8; iVar8 = iVar8 + 1) {
      iVar9 = iVar7;
      if (isRowMajor) {
        iVar9 = iVar10;
      }
      if (iVar3 != 0 || iVar8 != 0) {
        std::operator<<(src,", ");
        precision = extraout_EDX_00;
      }
      de::floatToString_abi_cxx11_
                (&local_50,(de *)0x1,*(float *)((long)valuePtr + (long)iVar9),precision);
      std::operator<<(src,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      iVar7 = iVar7 + 4;
      iVar10 = iVar10 + matrixStride;
      precision = extraout_EDX_01;
    }
    iVar6 = iVar6 + matrixStride;
    iVar11 = iVar11 + 4;
  }
  std::operator<<(src,")");
  return;
}

Assistant:

void generateImmMatrixSrc (std::ostream& src, glu::DataType basicType, int matrixStride, bool isRowMajor, const void* valuePtr)
{
	DE_ASSERT(glu::isDataTypeMatrix(basicType));

	const int		compSize		= sizeof(deUint32);
	const int		numRows			= glu::getDataTypeMatrixNumRows(basicType);
	const int		numCols			= glu::getDataTypeMatrixNumColumns(basicType);

	src << glu::getDataTypeName(basicType) << "(";

	// Constructed in column-wise order.
	for (int colNdx = 0; colNdx < numCols; colNdx++)
	{
		for (int rowNdx = 0; rowNdx < numRows; rowNdx++)
		{
			const deUint8*	compPtr	= (const deUint8*)valuePtr + (isRowMajor ? rowNdx*matrixStride + colNdx*compSize
																				: colNdx*matrixStride + rowNdx*compSize);

			if (colNdx > 0 || rowNdx > 0)
				src << ", ";

			src << de::floatToString(*((const float*)compPtr), 1);
		}
	}

	src << ")";
}